

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int bsread(bstring r,bStream *s,int n)

{
  int iVar1;
  
  if ((((s != (bStream *)0x0) && (r != (bstring)0x0 && s->buff != (bstring)0x0)) && (0 < n)) &&
     (0 < r->mlen)) {
    iVar1 = balloc(s->buff,s->maxBuffSz + 1);
    if (iVar1 == 0) {
      r->slen = 0;
      iVar1 = bsreada(r,s,n);
      return iVar1;
    }
  }
  return -1;
}

Assistant:

int bsread (bstring r, struct bStream * s, int n) {
	if (s == NULL || s->buff == NULL || r == NULL || r->mlen <= 0
	 || n <= 0) return BSTR_ERR;
	if (BSTR_OK != balloc (s->buff, s->maxBuffSz + 1)) return BSTR_ERR;
	r->slen = 0;
	return bsreada (r, s, n);
}